

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgxvar.c
# Opt level: O3

void ft_var_to_normalized(TT_Face face,FT_UInt num_coords,FT_Fixed *coords,FT_Fixed *normalized)

{
  GX_Blend pGVar1;
  FT_MM_Var *pFVar2;
  long lVar3;
  GX_AVarTable pGVar4;
  GX_AVarCorrespondence pGVar5;
  FT_UInt *pFVar6;
  FT_ItemVarDelta FVar7;
  FT_Long FVar8;
  FT_Pointer P;
  ulong uVar9;
  long lVar10;
  FT_UInt outerIndex;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  GX_AVarSegment pGVar14;
  GX_AVarTable table;
  uint uVar15;
  FT_UInt innerIndex;
  FT_Fixed *pFVar16;
  FT_Error error;
  FT_Error local_3c;
  FT_Memory local_38;
  
  local_3c = 0;
  local_38 = (face->root).memory;
  pGVar1 = face->blend;
  pFVar2 = pGVar1->mmvar;
  uVar15 = pFVar2->num_axis;
  if (uVar15 < num_coords) {
    num_coords = uVar15;
  }
  if (num_coords != 0) {
    pFVar16 = &pFVar2->axis->maximum;
    uVar11 = 0;
    do {
      lVar12 = coords[uVar11];
      lVar3 = pFVar16[-1];
      if (lVar12 - lVar3 == 0 || lVar12 < lVar3) {
        if (lVar12 < lVar3) {
          FVar8 = -0x10000;
          if (pFVar16[-2] < lVar12) {
            lVar10 = lVar3 - pFVar16[-2];
            goto LAB_0025633b;
          }
        }
        else {
          FVar8 = 0;
        }
      }
      else {
        FVar8 = 0x10000;
        if (lVar12 < *pFVar16) {
          lVar10 = *pFVar16 - lVar3;
LAB_0025633b:
          FVar8 = FT_DivFix(lVar12 - lVar3,lVar10);
        }
      }
      normalized[uVar11] = FVar8;
      uVar11 = uVar11 + 1;
      pFVar16 = pFVar16 + 6;
    } while (num_coords != uVar11);
    uVar15 = pFVar2->num_axis;
  }
  if (num_coords < uVar15) {
    memset(normalized + num_coords,0,(ulong)(~num_coords + uVar15) * 8 + 8);
  }
  pGVar4 = pGVar1->avar_table;
  if (pGVar4 != (GX_AVarTable)0x0) {
    pGVar14 = pGVar4->avar_segment;
    if (pGVar14 != (GX_AVarSegment)0x0) {
      if (uVar15 == 0) {
        uVar15 = 0;
      }
      else {
        uVar11 = 0;
        do {
          if (1 < pGVar14->pairCount) {
            pGVar5 = pGVar14->correspondence;
            lVar12 = 0;
            do {
              lVar3 = *(long *)((long)&pGVar5[1].fromCoord + lVar12);
              if (normalized[uVar11] < lVar3) {
                lVar10 = *(long *)((long)&pGVar5->fromCoord + lVar12);
                FVar8 = FT_MulDiv(normalized[uVar11] - lVar10,
                                  *(long *)((long)&pGVar5[1].toCoord + lVar12) -
                                  *(long *)((long)&pGVar5->toCoord + lVar12),lVar3 - lVar10);
                normalized[uVar11] =
                     FVar8 + *(long *)((long)&pGVar14->correspondence->toCoord + lVar12);
                uVar15 = pFVar2->num_axis;
                break;
              }
              lVar12 = lVar12 + 0x10;
            } while ((ulong)pGVar14->pairCount * 0x10 + -0x10 != lVar12);
          }
          uVar11 = uVar11 + 1;
          pGVar14 = pGVar14 + 1;
        } while (uVar11 < uVar15);
      }
    }
    if (((pGVar4->itemStore).varData != (GX_ItemVarData)0x0) &&
       (P = ft_mem_qrealloc(local_38,8,0,(ulong)uVar15,(void *)0x0,&local_3c), local_3c == 0)) {
      pFVar16 = face->blend->normalizedcoords;
      face->blend->normalizedcoords = normalized;
      if (pFVar2->num_axis != 0) {
        uVar11 = 0;
        do {
          pFVar6 = (pGVar4->axisMap).innerIndex;
          if (pFVar6 == (FT_UInt *)0x0) {
            outerIndex = 0;
            innerIndex = (FT_UInt)uVar11;
          }
          else {
            uVar9 = (pGVar4->axisMap).mapCount;
            uVar13 = (ulong)((int)uVar9 - 1);
            if (uVar11 < uVar9) {
              uVar13 = uVar11;
            }
            outerIndex = (pGVar4->axisMap).outerIndex[uVar13 & 0xffffffff];
            innerIndex = pFVar6[uVar13 & 0xffffffff];
          }
          lVar12 = normalized[uVar11];
          FVar7 = tt_var_get_item_delta(face,&pGVar4->itemStore,outerIndex,innerIndex);
          lVar12 = (FVar7 << 2) + lVar12;
          if (0xffff < lVar12) {
            lVar12 = 0x10000;
          }
          if (lVar12 < -0xffff) {
            lVar12 = -0x10000;
          }
          *(long *)((long)P + uVar11 * 8) = lVar12;
          uVar11 = uVar11 + 1;
          uVar9 = (ulong)pFVar2->num_axis;
        } while (uVar11 < uVar9);
        if (uVar9 != 0) {
          uVar11 = 0;
          do {
            normalized[uVar11] = *(FT_Fixed *)((long)P + uVar11 * 8);
            uVar11 = uVar11 + 1;
          } while (uVar9 != uVar11);
        }
      }
      face->blend->normalizedcoords = pFVar16;
      ft_mem_free(local_38,P);
    }
  }
  return;
}

Assistant:

static void
  ft_var_to_normalized( TT_Face    face,
                        FT_UInt    num_coords,
                        FT_Fixed*  coords,
                        FT_Fixed*  normalized )
  {
    FT_Error   error  = FT_Err_Ok;
    FT_Memory  memory = face->root.memory;
    FT_UInt    i, j;

    GX_Blend        blend;
    FT_MM_Var*      mmvar;
    FT_Var_Axis*    a;
    GX_AVarSegment  av;

    FT_Fixed*  new_normalized = NULL;
    FT_Fixed*  old_normalized;


    blend = face->blend;
    mmvar = blend->mmvar;

    if ( num_coords > mmvar->num_axis )
    {
      FT_TRACE2(( "ft_var_to_normalized:"
                  " only using first %d of %d coordinates\n",
                  mmvar->num_axis, num_coords ));
      num_coords = mmvar->num_axis;
    }

    /* Axis normalization is a two-stage process.  First we normalize */
    /* based on the [min,def,max] values for the axis to be [-1,0,1]. */
    /* Then, if there's an `avar' table, we renormalize this range.   */

    a = mmvar->axis;
    for ( i = 0; i < num_coords; i++, a++ )
    {
      FT_Fixed  coord = coords[i];


      FT_TRACE5(( "    %d: %.5f\n", i, (double)coord / 65536 ));
      if ( coord > a->maximum || coord < a->minimum )
      {
        FT_TRACE1(( "ft_var_to_normalized: design coordinate %.5f\n",
                    (double)coord / 65536 ));
        FT_TRACE1(( "                      is out of range [%.5f;%.5f];"
                    " clamping\n",
                    (double)a->minimum / 65536,
                    (double)a->maximum / 65536 ));
      }

      if ( coord > a->def )
        normalized[i] = coord >= a->maximum ?  0x10000L :
                        FT_DivFix( SUB_LONG( coord, a->def ),
                                   SUB_LONG( a->maximum, a->def ) );
      else if ( coord < a->def )
        normalized[i] = coord <= a->minimum ? -0x10000L :
                        FT_DivFix( SUB_LONG( coord, a->def ),
                                   SUB_LONG( a->def, a->minimum ) );
      else
        normalized[i] = 0;
    }

    FT_TRACE5(( "\n" ));

    for ( ; i < mmvar->num_axis; i++ )
      normalized[i] = 0;

    if ( blend->avar_table )
    {
      GX_AVarTable  table = blend->avar_table;


      FT_TRACE5(( "normalized design coordinates"
                  " before applying `avar' data:\n" ));

      if ( table->avar_segment )
      {
        av = table->avar_segment;

        for ( i = 0; i < mmvar->num_axis; i++, av++ )
        {
          for ( j = 1; j < (FT_UInt)av->pairCount; j++ )
          {
            if ( normalized[i] < av->correspondence[j].fromCoord )
            {
              FT_TRACE5(( "  %.5f\n", (double)normalized[i] / 65536 ));

              normalized[i] =
                FT_MulDiv( normalized[i] - av->correspondence[j - 1].fromCoord,
                           av->correspondence[j].toCoord -
                             av->correspondence[j - 1].toCoord,
                           av->correspondence[j].fromCoord -
                             av->correspondence[j - 1].fromCoord ) +
                av->correspondence[j - 1].toCoord;
              break;
            }
          }
        }
      }

      if ( table->itemStore.varData )
      {
        if ( FT_QNEW_ARRAY( new_normalized, mmvar->num_axis ) )
          return;

        /* Install our half-normalized coordinates for the next */
        /* Item Variation Store to work with.                   */
        old_normalized                = face->blend->normalizedcoords;
        face->blend->normalizedcoords = normalized;

        for ( i = 0; i < mmvar->num_axis; i++ )
        {
          FT_Fixed  v          = normalized[i];
          FT_UInt   innerIndex = i;
          FT_UInt   outerIndex = 0;
          FT_Int    delta;


          if ( table->axisMap.innerIndex )
          {
            FT_UInt  idx = i;


            if ( idx >= table->axisMap.mapCount )
              idx = table->axisMap.mapCount - 1;

            outerIndex = table->axisMap.outerIndex[idx];
            innerIndex = table->axisMap.innerIndex[idx];
          }

          delta = tt_var_get_item_delta( face,
                                         &table->itemStore,
                                         outerIndex,
                                         innerIndex );

	  v += delta << 2;

	  /* Clamp value range. */
	  v = v >=  0x10000L ?  0x10000 : v;
	  v = v <= -0x10000L ? -0x10000 : v;

          new_normalized[i] = v;
        }

        for ( i = 0; i < mmvar->num_axis; i++ )
        {
          normalized[i] = new_normalized[i];
        }

        face->blend->normalizedcoords = old_normalized;

        FT_FREE( new_normalized );
      }
    }
  }